

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::WasmByteCodeWriter::TryWriteFloat32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,int C1,int C2,int C3,int C4)

{
  bool bVar1;
  undefined2 local_1a;
  int local_18;
  undefined1 auStack_14 [2];
  OpLayoutT_Float32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((DAT_0143bfdd == '\0') && (local_1a = (undefined2)R0, R0 < 0x10000)) {
    layout.C2 = C4;
    local_18 = C1;
    _auStack_14 = C2;
    layout.C1 = C3;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_1a,0x12,
               &this->super_ByteCodeWriter,false);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteFloat32x4_IntConst4(OpCodeAsmJs op, RegSlot R0, int C1, int C2, int C3, int C4)
    {
        OpLayoutT_Float32x4_IntConst4<SizePolicy> layout;
        if (SizePolicy::Assign(layout.F4_0, R0) && 
            SizePolicy::Assign(layout.C1, C1) && 
            SizePolicy::Assign(layout.C2, C2) &&
            SizePolicy::Assign(layout.C3, C3) &&
            SizePolicy::Assign(layout.C4, C4)
            )
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }